

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O0

uint __thiscall
QFragmentMapData<QTextBlockData>::next(QFragmentMapData<QTextBlockData> *this,uint n)

{
  QTextBlockData *pQVar1;
  uint in_ESI;
  QFragmentMapData<QTextBlockData> *in_RDI;
  bool bVar2;
  uint y;
  uint local_10;
  uint local_c;
  
  pQVar1 = F(in_RDI,in_ESI);
  if ((pQVar1->super_QFragment<3>).right == 0) {
    pQVar1 = F(in_RDI,in_ESI);
    local_10 = (pQVar1->super_QFragment<3>).parent;
    local_c = in_ESI;
    while( true ) {
      pQVar1 = F(in_RDI,local_c);
      bVar2 = false;
      if ((pQVar1->super_QFragment<3>).parent != 0) {
        pQVar1 = F(in_RDI,local_10);
        bVar2 = local_c == (pQVar1->super_QFragment<3>).right;
      }
      if (!bVar2) break;
      local_c = local_10;
      pQVar1 = F(in_RDI,local_10);
      local_10 = (pQVar1->super_QFragment<3>).parent;
    }
    local_c = local_10;
  }
  else {
    pQVar1 = F(in_RDI,in_ESI);
    local_c = (pQVar1->super_QFragment<3>).right;
    while (pQVar1 = F(in_RDI,local_c), (pQVar1->super_QFragment<3>).left != 0) {
      pQVar1 = F(in_RDI,local_c);
      local_c = (pQVar1->super_QFragment<3>).left;
    }
  }
  return local_c;
}

Assistant:

uint QFragmentMapData<Fragment>::next(uint n) const {
    Q_ASSERT(n);
    if (F(n).right) {
        n = F(n).right;
        while (F(n).left)
            n = F(n).left;
    } else {
        uint y = F(n).parent;
        while (F(n).parent && n == F(y).right) {
            n = y;
            y = F(y).parent;
        }
        n = y;
    }
    return n;
}